

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O3

void __thiscall
cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph
          (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *this,
          Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster)

{
  pointer pEVar1;
  pointer pEVar2;
  pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  IntBitSet<unsigned_int> *pIVar10;
  long in_FS_OFFSET;
  bool bVar11;
  allocator_type local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
  ::vector(&this->entries,
           ((long)(cluster->
                  super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(cluster->
                  super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_21);
  ppVar3 = (cluster->
           super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((cluster->
      super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
    uVar5 = 1;
    uVar4 = 0;
    do {
      pEVar2[uVar4].feerate.size = ppVar3[uVar4].first.size;
      pEVar2[uVar4].feerate.fee = ppVar3[uVar4].first.fee;
      ppVar3 = (cluster->
               super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->entries).
               super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar2[uVar4].ancestors.m_val = ppVar3[uVar4].second.m_val | 1 << (uVar5 - 1 & 0x1f);
      uVar4 = (ulong)uVar5;
      uVar7 = ((long)(cluster->
                     super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3 >> 3) *
              -0x5555555555555555;
      uVar5 = uVar5 + 1;
    } while (uVar4 <= uVar7 && uVar7 - uVar4 != 0);
  }
  pEVar1 = (this->entries).
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pEVar1 - (long)pEVar2;
  if (lVar6 != 0) {
    uVar7 = (lVar6 >> 3) * -0x5555555555555555;
    uVar4 = 0;
    do {
      uVar5 = pEVar2[uVar4].ancestors.m_val;
      uVar9 = 1;
      pIVar10 = &pEVar2->ancestors;
      do {
        if ((pIVar10->m_val & 1 << ((byte)uVar4 & 0x1f)) != 0) {
          pIVar10->m_val = pIVar10->m_val | uVar5;
        }
        pIVar10 = pIVar10 + 6;
        bVar11 = uVar9 <= uVar7;
        lVar6 = uVar7 - uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar11 && lVar6 != 0);
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 <= uVar7 && uVar7 - uVar4 != 0);
    if (pEVar1 != pEVar2) {
      uVar4 = 0;
      do {
        uVar5 = pEVar2[uVar4].ancestors.m_val;
        if (uVar5 != 0) {
          uVar8 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          do {
            pEVar2[uVar8].descendants.m_val =
                 pEVar2[uVar8].descendants.m_val | 1 << ((byte)uVar4 & 0x1f);
            uVar5 = uVar5 - 1 & uVar5;
            uVar8 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
          } while (uVar5 != 0);
        }
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (uVar4 <= uVar7 && uVar7 - uVar4 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit DepGraph(const Cluster<SetType>& cluster) noexcept : entries(cluster.size())
    {
        for (ClusterIndex i = 0; i < cluster.size(); ++i) {
            // Fill in fee and size.
            entries[i].feerate = cluster[i].first;
            // Fill in direct parents as ancestors.
            entries[i].ancestors = cluster[i].second;
            // Make sure transactions are ancestors of themselves.
            entries[i].ancestors.Set(i);
        }

        // Propagate ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            // At this point, entries[a].ancestors[b] is true iff b is an ancestor of a and there
            // is a path from a to b through the subgraph consisting of {a, b} union
            // {0, 1, ..., (i-1)}.
            SetType to_merge = entries[i].ancestors;
            for (ClusterIndex j = 0; j < entries.size(); ++j) {
                if (entries[j].ancestors[i]) {
                    entries[j].ancestors |= to_merge;
                }
            }
        }

        // Fill in descendant information by transposing the ancestor information.
        for (ClusterIndex i = 0; i < entries.size(); ++i) {
            for (auto j : entries[i].ancestors) {
                entries[j].descendants.Set(i);
            }
        }
    }